

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O0

fe_node * fe_load_node(fe_state *s)

{
  int iVar1;
  float fVar2;
  uchar *c_3;
  int i_5;
  int alpha_num_1;
  fe_color *c_2;
  int i_4;
  int colors_1;
  fe_grad *grad_1;
  fe_node_fill_radial *nf_1;
  fe_plane *plane;
  uchar *c_1;
  int i_3;
  int alpha_num;
  fe_color *c;
  int i_2;
  int colors;
  fe_grad *grad;
  fe_node_fill *nf;
  fe_node *node;
  int i_1;
  int i;
  fe_node nd;
  fe_state *s_local;
  
  nd._136_8_ = s;
  read_token(s);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  if (**(char **)nd._136_8_ != '*') {
    *(undefined1 *)(nd._136_8_ + 0x14) = 1;
  }
  *(long *)nd._136_8_ = *(long *)nd._136_8_ + 1;
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  fe_node_init((fe_node *)&i_1,0,(get_node_image)0x0);
  nd.id = atoi(*(char **)nd._136_8_);
  i_1 = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  i = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  nd.flags = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  nd.type = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  nd.name._8_4_ = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  nd.name._12_4_ = read_int((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  for (node._4_4_ = 0; node._4_4_ < 4; node._4_4_ = node._4_4_ + 1) {
    fVar2 = read_float((fe_state *)nd._136_8_);
    nd.properties_float[(long)node._4_4_ + -2] = fVar2;
  }
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  for (node._0_4_ = 0; (int)node < 4; node._0_4_ = (int)node + 1) {
    fVar2 = (float)read_int((fe_state *)nd._136_8_);
    nd.properties_float[(long)(int)node + 2] = fVar2;
  }
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  read_token((fe_state *)nd._136_8_);
  if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
    error();
  }
  safe_strcpy<16ul>((char (*) [16])((long)&nd.effect + 4),*(char **)nd._136_8_);
  switch(nd.id) {
  case 1:
    nf = (fe_node_fill *)fe_node_image_alloc();
    break;
  case 2:
    nf = (fe_node_fill *)fe_node_image_fixed_alloc();
    break;
  case 3:
    nf = fe_node_fill_alloc();
    *(long *)(nd._136_8_ + 8) = *(long *)(nd._136_8_ + 8) + 1;
    *(int *)(nd._136_8_ + 0x10) = *(int *)(nd._136_8_ + 0x10) + -1;
    iVar1 = read_int((fe_state *)nd._136_8_);
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    (nf->grad).colors_num = iVar1;
    for (c._0_4_ = 0; (int)c < iVar1; c._0_4_ = (int)c + 1) {
      read_token((fe_state *)nd._136_8_);
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
      parse_color(*(char **)nd._136_8_,(nf->grad).colors + (int)c);
      fVar2 = read_float((fe_state *)nd._136_8_);
      (nf->grad).colors_pos[(int)c] = fVar2;
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
    }
    iVar1 = read_int((fe_state *)nd._136_8_);
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    (nf->grad).alpha_num = iVar1;
    for (c_1._0_4_ = 0; (int)c_1 < iVar1; c_1._0_4_ = (int)c_1 + 1) {
      read_token((fe_state *)nd._136_8_);
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
      parse_alpha(*(char **)nd._136_8_,(nf->grad).alpha + (int)c_1);
      fVar2 = read_float((fe_state *)nd._136_8_);
      (nf->grad).alpha_pos[(int)c_1] = fVar2;
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
    }
    fVar2 = read_float((fe_state *)nd._136_8_);
    (nf->plane).a = fVar2;
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    fVar2 = read_float((fe_state *)nd._136_8_);
    (nf->plane).b = fVar2;
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    fVar2 = read_float((fe_state *)nd._136_8_);
    (nf->plane).d = fVar2;
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    fVar2 = read_float((fe_state *)nd._136_8_);
    (nf->plane).scale = fVar2;
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    break;
  default:
    nf = (fe_node_fill *)fe_node_alloc(nd.id);
    break;
  case 0xc:
    nf = (fe_node_fill *)fe_node_fill_radial_alloc();
    *(long *)(nd._136_8_ + 8) = *(long *)(nd._136_8_ + 8) + 1;
    *(int *)(nd._136_8_ + 0x10) = *(int *)(nd._136_8_ + 0x10) + -1;
    iVar1 = read_int((fe_state *)nd._136_8_);
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    (nf->grad).colors_num = iVar1;
    for (c_2._0_4_ = 0; (int)c_2 < iVar1; c_2._0_4_ = (int)c_2 + 1) {
      read_token((fe_state *)nd._136_8_);
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
      parse_color(*(char **)nd._136_8_,(nf->grad).colors + (int)c_2);
      fVar2 = read_float((fe_state *)nd._136_8_);
      (nf->grad).colors_pos[(int)c_2] = fVar2;
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
    }
    iVar1 = read_int((fe_state *)nd._136_8_);
    if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
      error();
    }
    (nf->grad).alpha_num = iVar1;
    for (c_3._0_4_ = 0; (int)c_3 < iVar1; c_3._0_4_ = (int)c_3 + 1) {
      read_token((fe_state *)nd._136_8_);
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
      parse_alpha(*(char **)nd._136_8_,(nf->grad).alpha + (int)c_3);
      fVar2 = read_float((fe_state *)nd._136_8_);
      (nf->grad).alpha_pos[(int)c_3] = fVar2;
      if ((*(byte *)(nd._136_8_ + 0x14) & 1) != 0) {
        error();
      }
    }
  }
  nd._16_8_ = (nf->base).get_image;
  memcpy(nf,&i_1,0x90);
  return &nf->base;
}

Assistant:

fe_node* fe_load_node(fe_state& s)
{
    read_token(s);
    CHECK_ERR();

    if (*s.token != '*')
        s.error = 1;
    s.token++;//skip *
    CHECK_ERR();

    fe_node nd;   
    fe_node_init(&nd, 0, 0);

    nd.type = atoi(s.token);
    nd.id = READ_INT(s);
    nd.flags = READ_INT(s);
    nd.x = READ_INT(s);
    nd.y = READ_INT(s);
    nd.vis_x = READ_INT(s);
    nd.vis_y = READ_INT(s);
    

    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_float[i] = READ_FLOAT(s);
    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_int[i] = READ_INT(s);
    
    read_token(s);
    CHECK_ERR();

    safe_strcpy(nd.name, s.token);


    fe_node* node = 0;
    switch (nd.type)
    {
        case fe_node_type_source_image:
            node = &fe_node_image_alloc()->base;
            break;

        case fe_node_type_image_fixed:
            node = &fe_node_image_fixed_alloc()->base;
            break;

        case fe_node_type_fill:
        {
            fe_node_fill* nf = fe_node_fill_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

            fe_plane &plane = nf->plane;
            plane.a = READ_FLOAT(s);
            plane.b = READ_FLOAT(s);
            plane.d = READ_FLOAT(s);
            plane.scale = READ_FLOAT(s);

        } break;

        case fe_node_type_fill_radial:
        {
            fe_node_fill_radial* nf = fe_node_fill_radial_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

        } break;

        default:
        {
            node = fe_node_alloc(nd.type);
            break;
        }
    }
        
    nd.get_image = node->get_image;
    memcpy(node, &nd, sizeof(nd));

    return node;
}